

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pizza_cutter.cpp
# Opt level: O1

bool __thiscall pizza_cutter::is_new_part_valid(pizza_cutter *this,pizza_slice new_part)

{
  pointer pvVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int *piVar12;
  
  bVar4 = false;
  if (((-1 < (long)new_part._0_8_) && (uVar8 = new_part.row1, -1 < (int)uVar8)) &&
     (pvVar1 = (this->pizza_).
               super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start, bVar4 = false,
     (ulong)(new_part._8_8_ >> 0x20) <
     (ulong)((long)*(pointer *)
                    ((long)&(pvVar1->super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>).
                            _M_impl.super__Vector_impl_data + 8) -
             *(long *)&(pvVar1->super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>)._M_impl
                       .super__Vector_impl_data >> 3))) {
    iVar5 = new_part.row2;
    if ((ulong)(long)iVar5 <
        (ulong)(((long)(this->pizza_).
                       super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
               -0x5555555555555555)) {
      bVar4 = iVar5 < (int)uVar8;
      if ((int)uVar8 <= iVar5) {
        uVar10 = new_part._0_8_ >> 0x20;
        iVar11 = new_part.col2;
        uVar9 = (ulong)(uVar8 & 0x7fffffff);
        do {
          if (new_part.col1 <= iVar11) {
            lVar2 = *(long *)&pvVar1[uVar9].
                              super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>._M_impl;
            bVar3 = iVar11 < new_part.col1;
            if (*(int *)(lVar2 + 4 + uVar10 * 8) == -1) {
              piVar12 = (int *)(lVar2 + uVar10 * 8 + 0xc);
              uVar7 = uVar10;
              do {
                iVar6 = (int)uVar7;
                bVar3 = iVar11 <= iVar6;
                if (iVar11 <= iVar6) goto LAB_00103570;
                uVar7 = (ulong)(iVar6 + 1);
                iVar6 = *piVar12;
                piVar12 = piVar12 + 2;
              } while (iVar6 == -1);
            }
            if (!bVar3) {
              return bVar4;
            }
          }
LAB_00103570:
          iVar6 = (int)uVar9;
          bVar4 = iVar5 <= iVar6;
          uVar9 = uVar9 + 1;
        } while (iVar6 < iVar5);
      }
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool pizza_cutter::is_new_part_valid(pizza_slice new_part) const noexcept
{
    if (new_part.col1 < 0 || new_part.col2 >= pizza_[0].size() ||
        new_part.row1 < 0 || new_part.row2 >= pizza_.size()) {
        return false;
    }

    for (int row = new_part.row1; row <= new_part.row2; ++row) {
        for (int col = new_part.col1; col <= new_part.col2; ++col) {
            if (pizza_[row][col].owner != -1)
                return false;
        }
    }

    return true;
}